

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O2

void ExpReplay::finish<MULTICLASS::mc_label>(expreplay *er)

{
  long lVar1;
  size_t n;
  ulong uVar2;
  
  lVar1 = 0x6828;
  for (uVar2 = 0; uVar2 < er->N; uVar2 = uVar2 + 1) {
    (*(code *)PTR_delete_label_002b5d70)();
    VW::dealloc_example((_func_void_void_ptr *)0x0,(example *)((long)er->buf + lVar1 + -0x6828),
                        (_func_void_void_ptr *)0x0);
    lVar1 = lVar1 + 0x68d0;
  }
  free(er->buf);
  free(er->filled);
  return;
}

Assistant:

void finish(expreplay& er)
{
  for (size_t n = 0; n < er.N; n++)
  {
    lp.delete_label(&er.buf[n].l);
    VW::dealloc_example(NULL, er.buf[n], NULL);  // TODO: need to free label
  }
  free(er.buf);
  free(er.filled);
}